

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O3

GetShapeLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_getshape(NeuralNetworkLayer *this)

{
  LayerUnion this_00;
  
  if (this->_oneof_case_[0] == 0x429) {
    this_00 = this->layer_;
  }
  else {
    clear_layer(this);
    this->_oneof_case_[0] = 0x429;
    this_00.convolution_ = (ConvolutionLayerParams *)operator_new(0x18);
    GetShapeLayerParams::GetShapeLayerParams(this_00.getshape_);
    (this->layer_).getshape_ = (GetShapeLayerParams *)this_00;
  }
  return (GetShapeLayerParams *)this_00.convolution_;
}

Assistant:

inline ::CoreML::Specification::GetShapeLayerParams* NeuralNetworkLayer::mutable_getshape() {
  if (!has_getshape()) {
    clear_layer();
    set_has_getshape();
    layer_.getshape_ = new ::CoreML::Specification::GetShapeLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.getShape)
  return layer_.getshape_;
}